

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Lodtalk::TemporalVariableLookup::generateStore
          (TemporalVariableLookup *this,Assembler *gen,FunctionalNode *functionalContext)

{
  int temporalIndex;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  FunctionalNode *functionalContext_local;
  Assembler *gen_local;
  TemporalVariableLookup *this_local;
  
  uVar2 = (*(this->super_VariableLookup)._vptr_VariableLookup[3])();
  if ((uVar2 & 1) == 0) {
    __assert_fail("isMutable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
                  ,0xc3,
                  "virtual void Lodtalk::TemporalVariableLookup::generateStore(MethodAssembler::Assembler &, FunctionalNode *) const"
                 );
  }
  if (-1 < this->temporalIndex) {
    if (this->temporalVectorIndex < 0) {
      MethodAssembler::Assembler::storeTemporal(gen,this->temporalIndex);
    }
    else {
      temporalIndex = this->temporalIndex;
      iVar1 = this->temporalVectorIndex;
      sVar3 = AST::FunctionalNode::getArgumentCount(functionalContext);
      MethodAssembler::Assembler::storeTemporalInVector(gen,temporalIndex,iVar1 + (int)sVar3);
    }
    return;
  }
  __assert_fail("temporalIndex >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
                ,0xc4,
                "virtual void Lodtalk::TemporalVariableLookup::generateStore(MethodAssembler::Assembler &, FunctionalNode *) const"
               );
}

Assistant:

virtual void generateStore(MethodAssembler::Assembler &gen, FunctionalNode *functionalContext) const
    {
        assert(isMutable());
        assert(temporalIndex >= 0);
        if(temporalVectorIndex >= 0)
        {
            gen.storeTemporalInVector(temporalIndex, temporalVectorIndex + (int)functionalContext->getArgumentCount());
        }
        else
        {
            gen.storeTemporal(temporalIndex);
        }
    }